

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portability_atexit.c
# Opt level: O1

void portability_atexit_destroy(void)

{
  atexit_node_type **ppaVar1;
  portability_atexit_fn *pp_Var2;
  atexit_node_type *__ptr;
  
  if (atexit_list != (atexit_node_type *)0x0) {
    do {
      __ptr = atexit_list;
      ppaVar1 = &atexit_list->next;
      pp_Var2 = &atexit_list->handler;
      atexit_list = *ppaVar1;
      if (*pp_Var2 != (portability_atexit_fn)0x0) {
        (**pp_Var2)();
      }
      free(__ptr);
    } while (atexit_list != (atexit_node_type *)0x0);
    atexit_list = (atexit_node_type *)0x0;
  }
  return;
}

Assistant:

static void portability_atexit_destroy(void)
{
	if (atexit_list != NULL)
	{
		do
		{
			struct atexit_node_type *prev = atexit_list;

			atexit_list = prev->next;

			if (prev->handler != NULL)
			{
				prev->handler();
			}

			free(prev);
		} while (atexit_list != NULL);

		atexit_list = NULL;
	}
}